

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_Message_impl.hpp
# Opt level: O2

string * __thiscall hrgls::Message::Value_abi_cxx11_(string *__return_storage_ptr__,Message *this)

{
  hrgls_Status hVar1;
  char *val;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->m_private->Message == (hrgls_Message)0x0) {
    this->m_private->status = 0x3ee;
  }
  else {
    hVar1 = hrgls_MessageGetValue();
    this->m_private->status = hVar1;
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

::std::string Message::Value() const
  {
    ::std::string ret;
    if (!m_private->Message) {
      m_private->status = hrgls_STATUS_NULL_OBJECT_POINTER;
      return ret;
    }
    const char *val = "";
    m_private->status = hrgls_MessageGetValue(m_private->Message, &val);
    ret = val;
    return ret;
  }